

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

int __thiscall PP_Expression::AND_expression(PP_Expression *this)

{
  bool bVar1;
  uint uVar2;
  undefined8 in_RDI;
  int value;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  undefined4 local_4;
  
  local_4 = equality_expression((PP_Expression *)
                                CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  bVar1 = Parser::test((Parser *)CONCAT44(local_4,in_stack_ffffffffffffffe8),
                       (Token)((ulong)in_RDI >> 0x20));
  if (bVar1) {
    uVar2 = AND_expression((PP_Expression *)CONCAT44(local_4,in_stack_ffffffffffffffe8));
    local_4 = local_4 & uVar2;
  }
  return local_4;
}

Assistant:

int PP_Expression::AND_expression()
{
    int value = equality_expression();
    if (test(PP_AND))
        return value & AND_expression();
    return value;
}